

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O3

void anon_unknown.dwarf_68dd5::invertM44f(M44f *m,float e)

{
  float fVar1;
  float fVar2;
  undefined4 *puVar3;
  ulong uVar4;
  long lVar5;
  float (*c) [4];
  float (*c_00) [4];
  bool bVar6;
  M44f ident2;
  M44f ident1;
  M44f inv2;
  M44f inv1;
  float local_128 [32];
  Matrix44<float> local_a8;
  Matrix44<float> local_68;
  
  uVar4 = 0;
  Imath_2_5::Matrix44<float>::inverse(&local_68,m,false);
  Imath_2_5::Matrix44<float>::gjInverse(&local_a8,m,false);
  c_00 = (float (*) [4])(local_128 + 0x10);
  local_128[0x1c] = 0.0;
  local_128[0x1d] = 0.0;
  local_128[0x1e] = 0.0;
  local_128[0x1f] = 0.0;
  local_128[0x18] = 0.0;
  local_128[0x19] = 0.0;
  local_128[0x1a] = 0.0;
  local_128[0x1b] = 0.0;
  local_128[0x14] = 0.0;
  local_128[0x15] = 0.0;
  local_128[0x16] = 0.0;
  local_128[0x17] = 0.0;
  local_128[0x10] = 0.0;
  local_128[0x11] = 0.0;
  local_128[0x12] = 0.0;
  local_128[0x13] = 0.0;
  Imath_2_5::Matrix44<float>::multiply(m,&local_68,(Matrix44<float> *)c_00);
  c = (float (*) [4])local_128;
  local_128[0xc] = 0.0;
  local_128[0xd] = 0.0;
  local_128[0xe] = 0.0;
  local_128[0xf] = 0.0;
  local_128[8] = 0.0;
  local_128[9] = 0.0;
  local_128[10] = 0.0;
  local_128[0xb] = 0.0;
  local_128[4] = 0.0;
  local_128[5] = 0.0;
  local_128[6] = 0.0;
  local_128[7] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  local_128[3] = 0.0;
  Imath_2_5::Matrix44<float>::multiply(m,&local_a8,(Matrix44<float> *)c);
  puVar3 = &Imath_2_5::identity44f;
  bVar6 = false;
  do {
    lVar5 = 0;
    do {
      fVar1 = (*(float (*) [4])*c_00)[lVar5];
      fVar2 = (float)puVar3[lVar5];
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (!bVar6) {
          __assert_fail("ident1.equalWithAbsError (identity44f, e)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                        ,0x3f,"void (anonymous namespace)::invertM44f(const M44f &, float)");
        }
        goto LAB_0012a8e2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    bVar6 = 2 < uVar4;
    uVar4 = uVar4 + 1;
    puVar3 = puVar3 + 4;
    c_00 = c_00 + 1;
  } while (uVar4 != 4);
LAB_0012a8e2:
  puVar3 = &Imath_2_5::identity44f;
  uVar4 = 0;
  bVar6 = false;
  do {
    lVar5 = 0;
    do {
      fVar1 = (*(float (*) [4])*c)[lVar5];
      fVar2 = (float)puVar3[lVar5];
      if (e < (float)(~-(uint)(fVar2 < fVar1) & (uint)(fVar2 - fVar1) |
                     (uint)(fVar1 - fVar2) & -(uint)(fVar2 < fVar1))) {
        if (bVar6) {
          return;
        }
        __assert_fail("ident2.equalWithAbsError (identity44f, e)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                      ,0x40,"void (anonymous namespace)::invertM44f(const M44f &, float)");
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    bVar6 = 2 < uVar4;
    uVar4 = uVar4 + 1;
    puVar3 = puVar3 + 4;
    c = c + 1;
  } while (uVar4 != 4);
  return;
}

Assistant:

void
invertM44f (const M44f &m, float e)
{
    M44f inv1 = m.inverse();
    M44f inv2 = m.gjInverse();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}